

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4_function_override.cpp
# Opt level: O2

char * do_left(char *str,uint ct)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = (char *)operator_new__((ulong)(ct + 1));
  uVar2 = (ulong)ct;
  for (uVar3 = 0; uVar4 = uVar2, uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pcVar1[uVar3] = str[uVar3];
  }
  for (; uVar4 <= uVar2; uVar4 = uVar4 + 1) {
    pcVar1[uVar4] = '\0';
  }
  return pcVar1;
}

Assistant:

char * do_left(const char * str, unsigned ct) {
    char * result = new char[ct + 1];// prepare last \0
    int i = 0;
    for (i; i < ct; i++) {
        result[i] = str[i];
    }
    while(i <= ct) {
        result[i++] = '\0';
    }
    return result;
}